

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

Cba_Ntk_t * Cba_NtkAlloc(Cba_Man_t *p,int NameId,int nIns,int nOuts,int nObjs,int nFins,int nFons)

{
  Vec_Int_t *pVVar1;
  Cba_Ntk_t *Entry;
  
  Entry = (Cba_Ntk_t *)calloc(1,0x1b0);
  if (-1 < (nObjs | nFins | nOuts | nIns | nFons)) {
    Entry->Id = (p->vNtks).nSize;
    Vec_PtrPush(&p->vNtks,Entry);
    Entry->NameId = NameId;
    Entry->pDesign = p;
    Vec_IntGrow(&Entry->vInputs,nIns);
    Vec_IntGrow(&Entry->vOutputs,nOuts);
    Vec_StrGrow(&Entry->vObjType,nObjs + 1);
    Vec_StrPush(&Entry->vObjType,'\0');
    pVVar1 = &Entry->vObjFin0;
    Vec_IntGrow(pVVar1,nObjs + 2);
    Vec_IntPush(pVVar1,0);
    Vec_IntPush(pVVar1,1);
    pVVar1 = &Entry->vObjFon0;
    Vec_IntGrow(pVVar1,nObjs + 2);
    Vec_IntPush(pVVar1,0);
    Vec_IntPush(pVVar1,1);
    Vec_IntGrow(&Entry->vFinFon,nFins + 1);
    Vec_IntPush(&Entry->vFinFon,0);
    Vec_IntGrow(&Entry->vFonObj,nFons + 1);
    Vec_IntPush(&Entry->vFonObj,0);
    return Entry;
  }
  __assert_fail("nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x1a5,"Cba_Ntk_t *Cba_NtkAlloc(Cba_Man_t *, int, int, int, int, int, int)");
}

Assistant:

static inline Cba_Ntk_t *  Cba_NtkAlloc( Cba_Man_t * p, int NameId, int nIns, int nOuts, int nObjs, int nFins, int nFons )
{    
    Cba_Ntk_t * pNew = ABC_CALLOC( Cba_Ntk_t, 1 );
    assert( nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0 );
    pNew->Id      = Vec_PtrSize(&p->vNtks);   Vec_PtrPush( &p->vNtks, pNew );
    pNew->NameId  = NameId;
    pNew->pDesign = p;
    Vec_IntGrow( &pNew->vInputs,  nIns );
    Vec_IntGrow( &pNew->vOutputs, nOuts );
    Vec_StrGrow( &pNew->vObjType, nObjs+1 );  Vec_StrPush( &pNew->vObjType,  (char)CBA_OBJ_NONE );
    Vec_IntGrow( &pNew->vObjFin0, nObjs+2 );  Vec_IntPush( &pNew->vObjFin0,  0 ); Vec_IntPush( &pNew->vObjFin0, 1 );
    Vec_IntGrow( &pNew->vObjFon0, nObjs+2 );  Vec_IntPush( &pNew->vObjFon0,  0 ); Vec_IntPush( &pNew->vObjFon0, 1 );
    Vec_IntGrow( &pNew->vFinFon,  nFins+1 );  Vec_IntPush( &pNew->vFinFon,   0 );
    Vec_IntGrow( &pNew->vFonObj,  nFons+1 );  Vec_IntPush( &pNew->vFonObj,   0 );
    return pNew;
}